

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

bool __thiscall Ptex::v2_2::PtexReader::tryClose(PtexReader *this)

{
  bool bVar1;
  PtexReader *in_RDI;
  
  if (in_RDI->_fp != (Handle)0x0) {
    bVar1 = Mutex::trylock((Mutex *)0x910816);
    if (!bVar1) {
      return false;
    }
    closeFP(in_RDI);
    Mutex::unlock((Mutex *)0x910837);
  }
  return true;
}

Assistant:

bool PtexReader::tryClose()
{
    if (_fp) {
        if (!readlock.trylock()) return false;
        closeFP();
        readlock.unlock();
    }
    return true;
}